

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

bool __thiscall
basisu::vector<basist::ktx2_level_index>::try_resize
          (vector<basist::ktx2_level_index> *this,size_t new_size_size_t,bool grow_hint)

{
  uint uVar1;
  bool bVar2;
  uint min_new_capacity;
  
  if (new_size_size_t >> 0x20 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x231,
                  "bool basisu::vector<basist::ktx2_level_index>::try_resize(size_t, bool) [T = basist::ktx2_level_index]"
                 );
  }
  uVar1 = this->m_size;
  min_new_capacity = (uint)new_size_size_t;
  if (uVar1 != min_new_capacity) {
    if (((uVar1 <= min_new_capacity) && (this->m_capacity < min_new_capacity)) &&
       (bVar2 = elemental_vector::increase_capacity
                          ((elemental_vector *)this,min_new_capacity,
                           uVar1 + 1 == min_new_capacity || grow_hint,0x18,object_mover,true),
       !bVar2)) {
      return false;
    }
    this->m_size = min_new_capacity;
  }
  return true;
}

Assistant:

inline bool try_resize(size_t new_size_size_t, bool grow_hint = false)
      {
         if (new_size_size_t > UINT32_MAX)
         {
            assert(0);
            return false;
         }

         uint32_t new_size = (uint32_t)new_size_size_t;

         if (m_size != new_size)
         {
            if (new_size < m_size)
               scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
            else
            {
               if (new_size > m_capacity)
               {
                  if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
                     return false;
               }

               scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
            }

            m_size = new_size;
         }

         return true;
      }